

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
* __thiscall
cfd::core::ConfidentialTransaction::GetTxInList
          (vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           *__return_storage_ptr__,ConfidentialTransaction *this)

{
  pointer pCVar1;
  pointer pCVar2;
  ConfidentialTxIn tx_in;
  ConfidentialTxInReference CStack_2e8;
  ConfidentialTxIn local_188;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar2 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar2 != pCVar1) {
    do {
      ConfidentialTxIn::ConfidentialTxIn(&local_188,pCVar2);
      ConfidentialTxInReference::ConfidentialTxInReference(&CStack_2e8,&local_188);
      ::std::
      vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ::emplace_back<cfd::core::ConfidentialTxInReference>(__return_storage_ptr__,&CStack_2e8);
      ConfidentialTxInReference::~ConfidentialTxInReference(&CStack_2e8);
      ConfidentialTxIn::~ConfidentialTxIn(&local_188);
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<ConfidentialTxInReference>  // force LF
ConfidentialTransaction::GetTxInList() const {
  std::vector<ConfidentialTxInReference> refs;
  for (ConfidentialTxIn tx_in : vin_) {
    refs.push_back(ConfidentialTxInReference(tx_in));
  }
  return refs;
}